

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O0

void pzgeom::TPZGeoTriangle::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  int64_t iVar5;
  _func_int **nelem;
  TPZChunkVector<TPZGeoNode,_10> *this;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  uint in_ESI;
  TPZGeoMesh *in_RDI;
  int64_t index;
  int j;
  int i_1;
  int i;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZManVector<double,_3> co;
  TPZGeoMesh *in_stack_fffffffffffffe10;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffe18;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffe20;
  int64_t in_stack_fffffffffffffe28;
  TPZManVector<double,_3> *in_stack_fffffffffffffe30;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffe40;
  double in_stack_fffffffffffffe48;
  TPZManVector<double,_3> *in_stack_fffffffffffffe50;
  undefined1 local_130 [12];
  int local_124;
  undefined8 local_120;
  int local_118;
  int local_114;
  TPZVec<long> local_110;
  TPZVec<double> local_d8 [2];
  TPZVec<double> local_90;
  TPZVec<double> local_58;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  uint local_c;
  TPZGeoMesh *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  TPZManVector<long,_3>::TPZManVector
            ((TPZManVector<long,_3> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
    pdVar3 = TPZVec<double>::operator[](local_20,(long)local_114);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](local_d8,(long)local_114);
    *pdVar3 = dVar1 / 3.0;
    pdVar3 = TPZVec<double>::operator[](local_18,(long)local_114);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_114);
    *pdVar3 = dVar1 + 0.5;
  }
  for (local_118 = 0; local_118 < 3; local_118 = local_118 + 1) {
    pztopology::TPZTriangle::ParametricDomainNodeCoord
              ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
               (TPZVec<double> *)in_stack_fffffffffffffe18);
    local_120 = 0;
    TPZManVector<double,_3>::Resize
              (in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48,
               (double *)in_stack_fffffffffffffe40);
    local_124 = 0;
    while( true ) {
      lVar4 = (long)local_124;
      iVar5 = TPZVec<double>::size(&local_58);
      if (iVar5 <= lVar4) break;
      pdVar3 = TPZVec<double>::operator[](&local_90,(long)local_124);
      in_stack_fffffffffffffe48 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](local_d8,(long)local_124);
      dVar1 = *pdVar3;
      pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_124);
      in_stack_fffffffffffffe48 = dVar1 * *pdVar3 + in_stack_fffffffffffffe48;
      iVar2 = rand();
      in_stack_fffffffffffffe50 =
           (TPZManVector<double,_3> *)
           (in_stack_fffffffffffffe48 + ((double)iVar2 * 0.2) / 2147483647.0 + -0.1);
      pdVar3 = TPZVec<double>::operator[](&local_58,(long)local_124);
      *pdVar3 = (double)in_stack_fffffffffffffe50;
      local_124 = local_124 + 1;
    }
    in_stack_fffffffffffffe40 = TPZGeoMesh::NodeVec(local_8);
    iVar2 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffe18);
    nelem = (_func_int **)(long)iVar2;
    this = (TPZChunkVector<TPZGeoNode,_10> *)TPZVec<long>::operator[](&local_110,(long)local_118);
    (this->super_TPZSavable)._vptr_TPZSavable = nelem;
    in_stack_fffffffffffffe20 = TPZGeoMesh::NodeVec(local_8);
    in_stack_fffffffffffffe18 =
         (TPZAdmChunkVector<TPZGeoNode,_10> *)TPZVec<long>::operator[](&local_110,(long)local_118);
    in_stack_fffffffffffffe10 =
         (TPZGeoMesh *)TPZChunkVector<TPZGeoNode,_10>::operator[](this,(int64_t)nelem);
    TPZGeoNode::Initialize
              ((TPZGeoNode *)in_stack_fffffffffffffe20,(TPZVec<double> *)in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10);
  }
  (*(local_8->super_TPZSavable)._vptr_TPZSavable[0xc])
            (local_8,2,&local_110,(ulong)local_c,local_130,1);
  TPZManVector<long,_3>::~TPZManVector((TPZManVector<long,_3> *)in_stack_fffffffffffffe10);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe10);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe10);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

void TPZGeoTriangle::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<REAL,3> co(3),shift(3),scale(3);
        TPZManVector<int64_t,3> nodeindexes(3);
        for (int i=0; i<3; i++) {
            scale[i] = size[i]/3.;
            shift[i] = 1./2.+lowercorner[i];
        }
        
        for (int i=0; i<NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            co.Resize(3, 0.);
            for (int j=0; j<co.size(); j++) {
                co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(ETriangle, nodeindexes, matid, index);
    }